

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O3

base_uint<256U> * __thiscall base_uint<256U>::operator=(base_uint<256U> *this,uint64_t b)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(uint64_t *)this->pn = b;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    this->pn[2] = 0;
    this->pn[3] = 0;
    this->pn[4] = 0;
    this->pn[5] = 0;
    this->pn[6] = 0;
    this->pn[7] = 0;
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator=(uint64_t b)
    {
        pn[0] = (unsigned int)b;
        pn[1] = (unsigned int)(b >> 32);
        for (int i = 2; i < WIDTH; i++)
            pn[i] = 0;
        return *this;
    }